

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferViewGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::BufferViewGLImpl::BufferViewGLImpl
          (BufferViewGLImpl *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
          GLContextState *CtxState,BufferViewDesc *ViewDesc,BufferGLImpl *pBuffer,
          bool bIsDefaultView)

{
  PFNGLTEXBUFFERPROC p_Var1;
  PFNGLTEXBUFFERRANGEPROC p_Var2;
  GLenum GVar3;
  BufferViewDesc *this_00;
  GLuint GVar4;
  GLBufferObj *pGVar5;
  long lVar6;
  long lVar7;
  GLTextureCreateReleaseHelper local_78;
  GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> local_74;
  uint local_68;
  GLenum local_64;
  GLenum err;
  GLenum GLFormat;
  BufferFormat *BuffFmt;
  BufferDesc *BuffDesc;
  GLTextureCreateReleaseHelper local_40;
  undefined1 local_39;
  BufferGLImpl *pBStack_38;
  bool bIsDefaultView_local;
  BufferGLImpl *pBuffer_local;
  BufferViewDesc *ViewDesc_local;
  GLContextState *CtxState_local;
  RenderDeviceGLImpl *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  BufferViewGLImpl *this_local;
  
  local_39 = bIsDefaultView;
  pBStack_38 = pBuffer;
  pBuffer_local = (BufferGLImpl *)ViewDesc;
  ViewDesc_local = (BufferViewDesc *)CtxState;
  CtxState_local = (GLContextState *)pDevice;
  pDevice_local = (RenderDeviceGLImpl *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  BufferViewBase<Diligent::EngineGLImplTraits>::BufferViewBase
            (&this->super_BufferViewBase<Diligent::EngineGLImplTraits>,pRefCounters,pDevice,ViewDesc
             ,(IBuffer *)pBuffer,bIsDefaultView,false);
  (this->super_BufferViewBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferViewDesc>
  .super_ObjectBase<Diligent::IBufferViewGL>.super_RefCountedObject<Diligent::IBufferViewGL>.
  super_IBufferViewGL.super_IBufferView.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_013a6e50;
  GLObjectWrappers::GLTextureCreateReleaseHelper::GLTextureCreateReleaseHelper(&local_40,0);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&this->m_GLTexBuffer,false,local_40);
  BuffFmt = (BufferFormat *)
            DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
            ::GetDesc((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                       *)pBStack_38);
  if (((*(char *)&(pBuffer_local->super_BufferBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                  .super_ObjectBase<Diligent::IBufferGL>.super_RefCountedObject<Diligent::IBufferGL>
                  .m_pRefCounters == '\x01') ||
      (*(char *)&(pBuffer_local->super_BufferBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                 .super_ObjectBase<Diligent::IBufferGL>.super_RefCountedObject<Diligent::IBufferGL>.
                 m_pRefCounters == '\x02')) &&
     ((((BufferDesc *)BuffFmt)->Mode == BUFFER_MODE_FORMATTED ||
      (((BufferDesc *)BuffFmt)->Mode == BUFFER_MODE_RAW)))) {
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::Create
              (&this->m_GLTexBuffer);
    GLContextState::BindTexture((GLContextState *)ViewDesc_local,-1,0x8c2a,&this->m_GLTexBuffer);
    _err = (VALUE_TYPE *)
           ((long)&(pBuffer_local->super_BufferBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                   .super_ObjectBase<Diligent::IBufferGL>.
                   super_RefCountedObject<Diligent::IBufferGL>.m_pRefCounters + 1);
    local_64 = 0;
    if ((BuffFmt[7].NumComponents == '\x01') || (*_err != VT_UNDEFINED)) {
      local_64 = TypeToGLTexFormat(*_err,(uint)*(byte *)((long)&(pBuffer_local->
                                                                                                                                
                                                  super_BufferBase<Diligent::EngineGLImplTraits>).
                                                  super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                                                  .super_ObjectBase<Diligent::IBufferGL>.
                                                  super_RefCountedObject<Diligent::IBufferGL>.
                                                  m_pRefCounters + 2),
                                   (Bool)(*(byte *)((long)&(pBuffer_local->
                                                                                                                      
                                                  super_BufferBase<Diligent::EngineGLImplTraits>).
                                                  super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                                                  .super_ObjectBase<Diligent::IBufferGL>.
                                                  super_RefCountedObject<Diligent::IBufferGL>.
                                                  m_pRefCounters + 3) & 1));
    }
    else {
      local_64 = 0x8236;
    }
    GVar3 = local_64;
    p_Var2 = __glewTexBufferRange;
    p_Var1 = __glewTexBuffer;
    if (((pBuffer_local->super_BufferBase<Diligent::EngineGLImplTraits>).
         super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
         .m_pDevice == (RenderDeviceGLImpl *)0x0) &&
       ((pBuffer_local->super_BufferBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
        .m_Desc.super_DeviceObjectAttribs.Name == *(Char **)&BuffFmt[2].IsNormalized)) {
      pGVar5 = BufferGLImpl::GetGLHandle(pBStack_38);
      GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)pGVar5);
      (*p_Var1)(0x8c2a,GVar3,GVar4);
    }
    else {
      pGVar5 = BufferGLImpl::GetGLHandle(pBStack_38);
      GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)pGVar5);
      lVar6 = StaticCast<long,unsigned_long>
                        ((unsigned_long *)
                         &(pBuffer_local->super_BufferBase<Diligent::EngineGLImplTraits>).
                          super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                          .m_pDevice);
      lVar7 = StaticCast<long,unsigned_long>
                        ((unsigned_long *)
                         &(pBuffer_local->super_BufferBase<Diligent::EngineGLImplTraits>).
                          super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                          .m_Desc);
      (*p_Var2)(0x8c2a,GVar3,GVar4,lVar6,lVar7);
    }
    local_68 = glGetError();
    if (local_68 != 0) {
      LogError<true,char[32],char[17],unsigned_int>
                (false,"BufferViewGLImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferViewGLImpl.cpp"
                 ,0x62,(char (*) [32])"Failed to create texture buffer",
                 (char (*) [17])"\nGL Error Code: ",&local_68);
    }
    this_00 = ViewDesc_local;
    GLObjectWrappers::GLTextureCreateReleaseHelper::GLTextureCreateReleaseHelper(&local_78,0);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
              (&local_74,false,local_78);
    GLContextState::BindTexture((GLContextState *)this_00,-1,0x8c2a,&local_74);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
              (&local_74);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::SetName
              (&this->m_GLTexBuffer,
               (this->super_BufferViewBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferViewDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
  }
  return;
}

Assistant:

BufferViewGLImpl::BufferViewGLImpl(IReferenceCounters*   pRefCounters,
                                   RenderDeviceGLImpl*   pDevice,
                                   GLContextState&       CtxState,
                                   const BufferViewDesc& ViewDesc,
                                   BufferGLImpl*         pBuffer,
                                   bool                  bIsDefaultView) :
    // clang-format off
    TBuffViewBase
    {
        pRefCounters,
        pDevice,
        ViewDesc,
        pBuffer,
        bIsDefaultView
    },
    m_GLTexBuffer{false}
// clang-format on
{
    const auto& BuffDesc = pBuffer->GetDesc();
    if ((ViewDesc.ViewType == BUFFER_VIEW_SHADER_RESOURCE || ViewDesc.ViewType == BUFFER_VIEW_UNORDERED_ACCESS) &&
        (BuffDesc.Mode == BUFFER_MODE_FORMATTED || BuffDesc.Mode == BUFFER_MODE_RAW))
    {
#ifdef _MSC_VER
#    pragma warning(push)
#    pragma warning(disable : 4127) // conditional expression is constant
#endif
        VERIFY(GL_TEXTURE_BUFFER != 0, "GL texture buffers are not supported");
#ifdef _MSC_VER
#    pragma warning(pop)
#endif

        m_GLTexBuffer.Create();
        CtxState.BindTexture(-1, GL_TEXTURE_BUFFER, m_GLTexBuffer);

        const auto& BuffFmt  = ViewDesc.Format;
        GLenum      GLFormat = 0;
        if (BuffDesc.Mode == BUFFER_MODE_FORMATTED || BuffFmt.ValueType != VT_UNDEFINED)
        {
            GLFormat = TypeToGLTexFormat(BuffFmt.ValueType, BuffFmt.NumComponents, BuffFmt.IsNormalized);
        }
        else
        {
            GLFormat = GL_R32UI;
        }

        if (ViewDesc.ByteOffset == 0 && ViewDesc.ByteWidth == BuffDesc.Size)
            glTexBuffer(GL_TEXTURE_BUFFER, GLFormat, pBuffer->GetGLHandle());
        else
        {
#if GL_ARB_texture_buffer_range
            glTexBufferRange(GL_TEXTURE_BUFFER, GLFormat, pBuffer->GetGLHandle(), StaticCast<GLintptr>(ViewDesc.ByteOffset), StaticCast<GLsizeiptr>(ViewDesc.ByteWidth));
#else
            (void)GLFormat;
            LOG_ERROR_AND_THROW("Unable to create view '", ViewDesc.Name, "' for buffer '", BuffDesc.Name,
                                "' because GL_ARB_texture_buffer_range extension is not available. "
                                "Only full-buffer views can be created on this device.");
#endif
        }
        DEV_CHECK_GL_ERROR_AND_THROW("Failed to create texture buffer");

        CtxState.BindTexture(-1, GL_TEXTURE_BUFFER, GLObjectWrappers::GLTextureObj(false));

        m_GLTexBuffer.SetName(m_Desc.Name);
    }
}